

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deltatimeinfo.cpp
# Opt level: O0

void __thiscall hbm::streaming::deltaTimeInfo::setDelta(deltaTimeInfo *this,Value *params)

{
  bool bVar1;
  runtime_error *this_00;
  ostream *poVar2;
  void *pvVar3;
  Value *this_01;
  ulong *in_RDI;
  uint64_t remainder;
  uint64_t ntpTimestamp;
  Value *timeObject;
  Value value;
  uint32_t subFraction;
  uint32_t fraction;
  uint32_t seconds;
  uint32_t samples;
  Value *in_stack_00000438;
  Value *in_stack_fffffffffffffd98;
  Value *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  Value *in_stack_fffffffffffffdb0;
  Value *in_stack_fffffffffffffdb8;
  Value *in_stack_fffffffffffffdd0;
  Value *in_stack_fffffffffffffde0;
  Value *in_stack_fffffffffffffde8;
  Value *in_stack_fffffffffffffe18;
  Value *in_stack_fffffffffffffe20;
  Value local_48;
  uint local_20;
  UInt local_1c;
  UInt local_18;
  UInt local_14;
  
  local_14 = 1;
  local_18 = 0;
  local_1c = 0;
  local_20 = 0;
  Json::Value::Value(in_stack_fffffffffffffdb0,(ValueType)((ulong)in_stack_fffffffffffffda8 >> 0x20)
                    );
  Json::Value::operator[](in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
  Json::Value::Value(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  Json::Value::operator=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  Json::Value::~Value(in_stack_fffffffffffffdd0);
  bVar1 = Json::Value::isNull(&local_48);
  if ((!bVar1) && (local_14 = Json::Value::asUInt(in_stack_00000438), local_14 == 0)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"samples must be > 0");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Json::Value::operator[](in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
  Json::Value::operator[](in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
  Json::Value::Value(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  bVar1 = Json::Value::operator==(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  Json::Value::~Value(in_stack_fffffffffffffdd0);
  if (bVar1) {
    Json::Value::operator[](in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
    Json::Value::Value(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    Json::Value::operator=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    Json::Value::~Value(in_stack_fffffffffffffdd0);
    bVar1 = Json::Value::isNull(&local_48);
    if (!bVar1) {
      local_18 = Json::Value::asUInt(in_stack_00000438);
    }
    Json::Value::operator[](in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
    Json::Value::Value(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    Json::Value::operator=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    Json::Value::~Value(in_stack_fffffffffffffdd0);
    bVar1 = Json::Value::isNull(&local_48);
    if (!bVar1) {
      local_1c = Json::Value::asUInt(in_stack_00000438);
    }
    Json::Value::operator[](in_stack_fffffffffffffdb8,(char *)in_stack_fffffffffffffdb0);
    Json::Value::Value(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    Json::Value::operator=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    Json::Value::~Value(in_stack_fffffffffffffdd0);
    bVar1 = Json::Value::isNull(&local_48);
    if (!bVar1) {
      local_20 = Json::Value::asUInt(in_stack_00000438);
    }
  }
  *in_RDI = CONCAT44(local_18,local_1c) / (ulong)local_14;
  in_RDI[1] = (ulong)local_20 / (ulong)local_14;
  in_RDI[1] = in_RDI[1] + ((*in_RDI % (ulong)local_14 << 0x20) / (ulong)local_14 & 0xffffffff);
  poVar2 = std::operator<<((ostream *)&std::cout,"setDelta");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"seconds = ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,local_18);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,std::hex);
  poVar2 = std::operator<<(poVar2," (0x");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18);
  poVar2 = std::operator<<(poVar2,")");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"fraction = ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,local_1c);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,std::hex);
  poVar2 = std::operator<<(poVar2," (0x");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1c);
  poVar2 = std::operator<<(poVar2,")");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  this_01 = (Value *)std::operator<<((ostream *)&std::cout,"subFraction = ");
  pvVar3 = (void *)std::ostream::operator<<(this_01,local_20);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,std::hex);
  poVar2 = std::operator<<(poVar2," (0x");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
  poVar2 = std::operator<<(poVar2,")");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::dec);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  Json::Value::~Value(this_01);
  return;
}

Assistant:

void deltaTimeInfo::setDelta(const Json::Value& params)
		{
			uint32_t samples = 1;
			uint32_t seconds = 0;
			uint32_t fraction = 0;
			uint32_t subFraction = 0;

			Json::Value value;

			value = params["samples"];
			if(value.isNull()==false) {
				samples = value.asUInt();
				if(samples==0) {
					throw std::runtime_error("samples must be > 0");
				}
			}

			const Json::Value& timeObject = params["delta"];
			if(timeObject["type"]=="ntp") {
				value = timeObject["seconds"];
				if(value.isNull()==false) {
					seconds = value.asUInt();
				}

				value = timeObject["fraction"];
				if(value.isNull()==false) {
					fraction = value.asUInt();
				}

				value = timeObject["subFraction"];
				if(value.isNull()==false) {
					subFraction = value.asUInt();
				}
			}
			uint64_t ntpTimestamp = seconds;
			ntpTimestamp <<= 32;
			ntpTimestamp |= fraction;



			// we are loosing precision here. In order to compensate this, we calculate a correction to use.
			m_deltaNtpTimestamp = ntpTimestamp/samples;
			m_deltaSubFraction = subFraction/samples;

			// determine remainder and calculate sub fraction from it.
			uint64_t remainder = m_deltaNtpTimestamp%samples;
			remainder <<= 32;
			remainder /= samples;
			m_deltaSubFraction += static_cast < uint32_t > (remainder & 0xffffffff);

			std::cout << __FUNCTION__ << std::endl;
			std::cout << "seconds = " << seconds << std::hex << " (0x" << seconds << ")" << std::dec << std::endl;
			std::cout << "fraction = " << fraction << std::hex << " (0x" << fraction << ")" << std::dec << std::endl;
			std::cout << "subFraction = " << subFraction << std::hex << " (0x" << subFraction << ")" << std::dec << std::endl;
		}